

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::SharedCtor
          (BayesianProbitRegressor_Gaussian *this)

{
  this->mean_ = 0.0;
  this->precision_ = 0.0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void BayesianProbitRegressor_Gaussian::SharedCtor() {
  ::memset(&mean_, 0, reinterpret_cast<char*>(&precision_) -
    reinterpret_cast<char*>(&mean_) + sizeof(precision_));
  _cached_size_ = 0;
}